

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O1

Am_Value option_button_items_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Object o;
  Am_Value v;
  Am_Object local_28;
  Am_Value local_20;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Value::operator=((Am_Value *)self,0);
  local_20.type = 0;
  local_20.value.wrapper_value = (Am_Wrapper *)0x0;
  local_28.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(in_RSI,0x68,1);
  Am_Value::operator=(&local_20,pAVar2);
  bVar1 = Am_Value::Valid(&local_20);
  if (bVar1) {
    Am_Object::operator=(&local_28,&local_20);
    pAVar2 = Am_Object::Get(&local_28,0x1d3,1);
    Am_Value::operator=(&local_20,pAVar2);
    bVar1 = Am_Value::Valid(&local_20);
    if (bVar1) {
      Am_Object::operator=(&local_28,&local_20);
      pAVar2 = Am_Object::Get(&local_28,0xa2,1);
      Am_Value::operator=((Am_Value *)self,pAVar2);
    }
  }
  Am_Object::~Am_Object(&local_28);
  Am_Value::~Am_Value(&local_20);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, option_button_items)
{
  Am_Value value;
  value = 0;
  Am_Value v;
  Am_Object o;
  v = self.Peek(Am_WINDOW);
  if (v.Valid()) {
    o = v;
    v = o.Peek(Am_FOR_ITEM);
    if (v.Valid()) {
      o = v;
      value = o.Peek(Am_ITEMS);
    }
  }
  return value;
}